

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLexer.h
# Opt level: O0

void __thiscall LStringLexer::~LStringLexer(LStringLexer *this)

{
  LStringLexer *this_local;
  
  ~LStringLexer(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~LStringLexer() override = default;